

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context_state.hpp
# Opt level: O1

vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> * __thiscall
duckdb::RegisteredStateManager::States
          (vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true>
           *__return_storage_ptr__,RegisteredStateManager *this)

{
  int iVar1;
  __node_base *p_Var2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    (__return_storage_ptr__->
    super_vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
    ).
    super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
    ).
    super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
    ).
    super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var2 = &(this->registered_state)._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      ::std::
      vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
      ::push_back(&__return_storage_ptr__->
                   super_vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
                  ,(value_type *)(p_Var2 + 5));
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

vector<shared_ptr<ClientContextState>> States() {
		lock_guard<mutex> l(lock);
		vector<shared_ptr<ClientContextState>> states;
		for (auto &entry : registered_state) {
			states.push_back(entry.second);
		}
		return states;
	}